

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::BeginDragDropTargetCustom(ImRect *bb,ImGuiID id)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  ImGuiID in_ESI;
  ImVec2 *in_RDI;
  ImVec2 *unaff_retaddr;
  ImGuiWindow *hovered_window;
  ImGuiWindow *window;
  ImGuiContext *g;
  bool in_stack_ffffffffffffffff;
  bool bVar3;
  
  pIVar2 = GImGui;
  if ((GImGui->DragDropActive & 1U) == 0) {
    bVar3 = false;
  }
  else {
    pIVar1 = GImGui->CurrentWindow;
    if ((GImGui->HoveredWindowUnderMovingWindow == (ImGuiWindow *)0x0) ||
       (pIVar1->RootWindow != GImGui->HoveredWindowUnderMovingWindow->RootWindow)) {
      bVar3 = false;
    }
    else {
      bVar3 = IsMouseHoveringRect((ImVec2 *)hovered_window,unaff_retaddr,in_stack_ffffffffffffffff);
      if ((bVar3) && (in_ESI != (pIVar2->DragDropPayload).SourceId)) {
        if ((pIVar1->SkipItems & 1U) == 0) {
          (pIVar2->DragDropTargetRect).Min = *in_RDI;
          (pIVar2->DragDropTargetRect).Max = in_RDI[1];
          pIVar2->DragDropTargetId = in_ESI;
          pIVar2->DragDropWithinTarget = true;
          bVar3 = true;
        }
        else {
          bVar3 = false;
        }
      }
      else {
        bVar3 = false;
      }
    }
  }
  return bVar3;
}

Assistant:

bool ImGui::BeginDragDropTargetCustom(const ImRect& bb, ImGuiID id)
{
    ImGuiContext& g = *GImGui;
    if (!g.DragDropActive)
        return false;

    ImGuiWindow* window = g.CurrentWindow;
    ImGuiWindow* hovered_window = g.HoveredWindowUnderMovingWindow;
    if (hovered_window == NULL || window->RootWindow != hovered_window->RootWindow)
        return false;
    IM_ASSERT(id != 0);
    if (!IsMouseHoveringRect(bb.Min, bb.Max) || (id == g.DragDropPayload.SourceId))
        return false;
    if (window->SkipItems)
        return false;

    IM_ASSERT(g.DragDropWithinTarget == false);
    g.DragDropTargetRect = bb;
    g.DragDropTargetId = id;
    g.DragDropWithinTarget = true;
    return true;
}